

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O2

int XMLNode_add_child(XMLNode *node,XMLNode *child)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (((child != (XMLNode *)0x0 && node != (XMLNode *)0x0) && (node->init_value == 0x19770522)) &&
     (iVar2 = 0, child->init_value == 0x19770522)) {
    iVar1 = _add_node(&node->children,&node->n_children,child);
    if (-1 < iVar1) {
      node->tag_type = TAG_FATHER;
      child->father = node;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int XMLNode_add_child(XMLNode* node, XMLNode* child)
{
	if (node == NULL || child == NULL || node->init_value != XML_INIT_DONE || child->init_value != XML_INIT_DONE)
		return FALSE;
	
	if (_add_node(&node->children, &node->n_children, child) >= 0) {
		node->tag_type = TAG_FATHER;
		child->father = node;
		return TRUE;
	} else
		return FALSE;
}